

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O2

LineHeight
Rml::ComputeLineHeight
          (Property *property,float font_size,float document_font_size,float dp_ratio,
          Vector2f vp_dimensions)

{
  Unit UVar1;
  code *pcVar2;
  bool bVar3;
  NumericValue value;
  ulong uVar4;
  float fVar5;
  float fVar6;
  LineHeight LVar7;
  
  UVar1 = property->unit;
  if ((UVar1 & LENGTH) == UNKNOWN) {
    if (UVar1 == PERCENT) {
      fVar5 = Variant::Get<float>(&property->value,0.0);
      fVar5 = fVar5 * 0.01;
    }
    else if (UVar1 == NUMBER) {
      fVar5 = Variant::Get<float>(&property->value,0.0);
    }
    else {
      bVar3 = Assert("Invalid unit for line-height",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                     ,0xb2);
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      fVar5 = 1.0;
    }
    fVar6 = font_size * fVar5;
    uVar4 = 0;
  }
  else {
    value = Property::GetNumericValue(property);
    fVar5 = ComputeLength(value,font_size,document_font_size,dp_ratio,vp_dimensions);
    uVar4 = 0x100000000;
    fVar6 = fVar5;
  }
  LVar7._0_8_ = (uint)fVar6 | uVar4;
  LVar7.inherit_value = fVar5;
  return LVar7;
}

Assistant:

Style::LineHeight ComputeLineHeight(const Property* property, float font_size, float document_font_size, float dp_ratio, Vector2f vp_dimensions)
{
	if (Any(property->unit & Unit::LENGTH))
	{
		float value = ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions);
		return Style::LineHeight(value, Style::LineHeight::Length, value);
	}

	float scale_factor = 1.0f;

	switch (property->unit)
	{
	case Unit::NUMBER: scale_factor = property->value.Get<float>(); break;
	case Unit::PERCENT: scale_factor = property->value.Get<float>() * 0.01f; break;
	default: RMLUI_ERRORMSG("Invalid unit for line-height");
	}

	float value = font_size * scale_factor;
	return Style::LineHeight(value, Style::LineHeight::Number, scale_factor);
}